

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilingHelpers.cpp
# Opt level: O3

void Js::ProfilingHelpers::ProfiledStElem
               (Var base,Var varIndex,Var value,FunctionBody *functionBody,ProfileId profileId,
               PropertyOperationFlags flags,bool didArrayAccessHelperCall,
               bool bailedOutOnArraySpecialization)

{
  Type TVar1;
  long lVar2;
  Type *pTVar3;
  code *pcVar4;
  byte bVar5;
  bool bVar6;
  FldInfoFlags oldFlags;
  FldInfoFlags newFlags;
  int iVar7;
  BOOL BVar8;
  undefined4 *puVar9;
  ScriptContext *scriptContext;
  JavascriptCopyOnAccessNativeIntArray *this;
  INT_PTR IVar10;
  RecyclableObject *pRVar11;
  DynamicProfileInfo *pDVar12;
  JavascriptArray *array;
  Var value_00;
  undefined6 in_register_00000082;
  undefined4 in_register_0000008c;
  ulong uVar13;
  uint uVar14;
  Var pvVar15;
  undefined4 uVar16;
  PropertyCacheOperationInfo local_9b;
  anon_union_2_4_ea848c7b_for_ValueType_13 aStack_98;
  undefined1 auStack_96 [3];
  PropertyCacheOperationInfo operationInfo;
  PropertyRecordUsageCache *propertyRecordUsageCache;
  RecyclableObject *object;
  FunctionBody *local_80;
  uint local_74;
  ScriptContext *local_70;
  undefined4 local_64;
  Var local_60;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_58;
  undefined2 uStack_56;
  undefined4 uStack_54;
  RecyclableObject *cacheOwner;
  TypeId local_44;
  Var pvStack_40;
  TypeId arrayTypeId;
  bool local_35;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  FldInfoFlags local_32;
  byte local_31;
  bool isObjectWithArray;
  
  object = (RecyclableObject *)CONCAT44(in_register_0000008c,flags);
  pvStack_40 = varIndex;
  if (base == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0xf1,"(base)","base");
    if (!bVar6) goto LAB_00af56b0;
    *puVar9 = 0;
  }
  if (pvStack_40 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0xf2,"(varIndex)","varIndex");
    if (!bVar6) goto LAB_00af56b0;
    *puVar9 = 0;
  }
  if (value == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0xf3,"(value)","value");
    if (!bVar6) goto LAB_00af56b0;
    *puVar9 = 0;
  }
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0xf4,"(functionBody)","functionBody");
    if (!bVar6) goto LAB_00af56b0;
    *puVar9 = 0;
  }
  if (profileId == 0xffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0xf5,"(profileId != Constants::NoProfileId)",
                                "profileId != Constants::NoProfileId");
    if (!bVar6) goto LAB_00af56b0;
    *puVar9 = 0;
  }
  local_60 = value;
  ValueType::ValueType((ValueType *)&local_34.field_0);
  local_32 = FldInfo_NoInfo;
  local_31 = bailedOutOnArraySpecialization * '@' + 1;
  bVar6 = VarIs<Js::RecyclableObject>(base);
  IVar10 = VirtualTableInfo<Js::JavascriptArray>::Address;
  if (bVar6) {
    lVar2 = *base;
    scriptContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
    if (lVar2 == IVar10) {
      bVar6 = JavascriptOperators::SetElementMayHaveImplicitCalls(scriptContext);
      if (!bVar6) {
        array = UnsafeVarTo<Js::JavascriptArray>(base);
        local_58.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::FromArray(Array,array,TypeIds_Array);
        local_34.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::ToLikely((ValueType *)&local_58.field_0);
        bVar6 = JavascriptArray::HasNoMissingValues(array);
        local_31 = local_31 & 0xfd | bVar6 * '\x02';
        ProfiledStElem_FastPath
                  (array,pvStack_40,local_60,scriptContext,(PropertyOperationFlags)object,
                   (StElemInfo *)&local_34.field_0);
        bVar6 = JavascriptArray::HasNoMissingValues(array);
        local_31 = local_31 & 0xfd | ((local_31 & 2) >> 1 & ~bVar6) * '\x02';
        pDVar12 = FunctionBody::GetDynamicProfileInfo(functionBody);
        goto LAB_00af569c;
      }
      local_70 = scriptContext;
      cacheOwner = (RecyclableObject *)UnsafeVarTo<Js::JavascriptArray>(base);
      local_35 = false;
      local_44 = TypeIds_Array;
    }
    else {
      local_70 = scriptContext;
      cacheOwner = (RecyclableObject *)
                   JavascriptArray::GetArrayForArrayOrObjectWithArray(base,&local_35,&local_44);
    }
LAB_00af4f8c:
    pvVar15 = pvStack_40;
    bVar6 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(base);
    if ((bVar6) &&
       (this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(base),
       this != (JavascriptCopyOnAccessNativeIntArray *)0x0)) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
    }
  }
  else {
    local_70 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
    cacheOwner = (RecyclableObject *)
                 JavascriptArray::GetArrayForArrayOrObjectWithArray(base,&local_35,&local_44);
    pvVar15 = pvStack_40;
    if (base != (Var)0x0) goto LAB_00af4f8c;
  }
  pRVar11 = cacheOwner;
  local_64 = (undefined4)CONCAT62(in_register_00000082,profileId);
  if (cacheOwner == (RecyclableObject *)0x0) {
    bVar6 = TypedArrayBase::TryGetLengthForOptimizedTypedArray
                      (base,(uint32 *)&local_58.bits,&local_44);
    bVar5 = local_31;
    if (bVar6) {
      local_74 = CONCAT22(uStack_56,local_58.bits);
      lVar2 = *base;
      local_80 = functionBody;
      IVar10 = ValueType::GetVirtualTypedArrayVtable(local_44);
      aStack_98.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromTypeId(local_44,lVar2 == IVar10);
      local_34.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::ToLikely((ValueType *)&aStack_98.field_0);
      pvVar15 = local_60;
      bVar6 = VarIs<Js::RecyclableObject>(local_60);
      if ((ulong)pvVar15 >> 0x32 == 0 && bVar6) {
        local_31 = local_31 | 8;
      }
      goto LAB_00af5115;
    }
  }
  else {
    if (local_35 == true) {
      local_80 = functionBody;
      local_58.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromObjectArray((JavascriptArray *)cacheOwner);
    }
    else {
      local_80 = functionBody;
      local_58.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromArray(Array,(JavascriptArray *)cacheOwner,local_44);
    }
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::ToLikely((ValueType *)&local_58.field_0);
    bVar6 = JavascriptArray::HasNoMissingValues((JavascriptArray *)pRVar11);
    local_31 = local_31 & 0xfd | bVar6 * '\x02';
    local_74 = *(uint *)&pRVar11[2].super_FinalizableObject.super_IRecyclerVisitedObject.
                         _vptr_IRecyclerVisitedObject;
    pTVar3 = pRVar11[2].type.ptr;
    if (pTVar3->typeId != TypeIds_Undefined) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                  ,0x134,"(head->left == 0)","head->left == 0");
      if (!bVar6) goto LAB_00af56b0;
      *puVar9 = 0;
    }
    uVar16 = *(undefined4 *)&pTVar3->flags;
    local_58.bits = (Type)uVar16;
    uStack_56 = (undefined2)((uint)uVar16 >> 0x10);
LAB_00af5115:
    if (didArrayAccessHelperCall) {
      local_31 = local_31 | 8;
    }
    uVar13 = (ulong)pvStack_40 & 0x1ffff00000000;
    if (uVar13 == 0x1000000000000 || ((ulong)pvStack_40 & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)pvStack_40 & 0xffff000000000000) != 0x1000000000000) {
        functionBody = local_80;
        pvVar15 = pvStack_40;
        bVar5 = local_31 | 8;
        goto LAB_00af5288;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar6) goto LAB_00af56b0;
      *puVar9 = 0;
    }
    if (uVar13 != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar6) goto LAB_00af56b0;
      *puVar9 = 0;
    }
    pvVar15 = pvStack_40;
    functionBody = local_80;
    uVar14 = (uint)pvStack_40;
    if ((int)uVar14 < 0) {
      bVar5 = local_31 | 8;
    }
    else if (uVar14 < CONCAT22(uStack_56,local_58.bits)) {
      bVar5 = local_31;
      if ((cacheOwner != (RecyclableObject *)0x0) &&
         (iVar7 = (*(cacheOwner->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x77])(cacheOwner,(ulong)pvStack_40 & 0xffffffff),
         bVar5 = local_31, (char)iVar7 != '\0')) {
        bVar5 = local_31 | 4;
      }
    }
    else {
      bVar5 = local_31 | 0x10;
      if ((local_35 == false) && (local_74 <= uVar14)) {
        bVar5 = local_31 | 0x30;
      }
    }
  }
LAB_00af5288:
  local_31 = bVar5;
  if (base == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar6) goto LAB_00af56b0;
    *puVar9 = 0;
LAB_00af5381:
    value_00 = local_60;
    uVar16 = local_64;
    pRVar11 = UnsafeVarTo<Js::RecyclableObject>(base);
    if (pRVar11 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar6) goto LAB_00af56b0;
      *puVar9 = 0;
      value_00 = local_60;
    }
    TVar1 = ((pRVar11->type).ptr)->typeId;
    if (0x57 < (int)TVar1) {
      BVar8 = RecyclableObject::IsExternal(pRVar11);
      pvVar15 = pvStack_40;
      if (BVar8 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        goto joined_r0x00af545d;
      }
      goto LAB_00af546e;
    }
    pvVar15 = pvStack_40;
    if (8 < TVar1 - TypeIds_Int8Array) goto LAB_00af546e;
LAB_00af556b:
    profileId = (ProfileId)uVar16;
    JavascriptOperators::OP_SetElementI
              (base,pvVar15,value_00,local_70,(PropertyOperationFlags)object);
  }
  else {
    if (((ulong)base & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)base & 0xffff000000000000) != 0x1000000000000) {
      value_00 = local_60;
      uVar16 = local_64;
      if ((ulong)base >> 0x32 == 0 && ((ulong)base & 0xffff000000000000) != 0x1000000000000)
      goto LAB_00af5381;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      value_00 = local_60;
      uVar16 = local_64;
joined_r0x00af545d:
      if (!bVar6) goto LAB_00af56b0;
      *puVar9 = 0;
      pvVar15 = pvStack_40;
    }
LAB_00af546e:
    profileId = (ProfileId)uVar16;
    bVar6 = JavascriptOperators::GetPropertyRecordUsageCache
                      (pvVar15,local_70,(PropertyRecordUsageCache **)&aStack_98,
                       (RecyclableObject **)&local_58);
    if (!bVar6) goto LAB_00af556b;
    propertyRecordUsageCache = (PropertyRecordUsageCache *)0x0;
    bVar6 = JavascriptOperators::GetPropertyObjectForSetElementI
                      (base,(Var)CONCAT44(uStack_54,CONCAT22(uStack_56,local_58.bits)),local_70,
                       (RecyclableObject **)&propertyRecordUsageCache);
    if (!bVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                  ,0x172,"(result)","result");
      if (!bVar6) {
LAB_00af56b0:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar9 = 0;
      value_00 = local_60;
    }
    local_9b.cacheType = CacheType_None;
    local_9b.slotType = SlotType_None;
    local_9b.isPolymorphic = false;
    JavascriptOperators::SetElementIWithCache<true>
              (base,(RecyclableObject *)propertyRecordUsageCache,
               (RecyclableObject *)CONCAT44(uStack_54,CONCAT22(uStack_56,local_58.bits)),value_00,
               (PropertyRecordUsageCache *)CONCAT62(_auStack_96,aStack_98.bits),local_70,
               (PropertyOperationFlags)object,&local_9b);
    oldFlags = DynamicProfileInfo::FldInfoFlagsFromCacheType(local_9b.cacheType);
    local_32 = oldFlags;
    newFlags = DynamicProfileInfo::FldInfoFlagsFromSlotType(local_9b.slotType);
    local_32 = DynamicProfileInfo::MergeFldInfoFlags(oldFlags,newFlags);
  }
  propertyRecordUsageCache =
       (PropertyRecordUsageCache *)CONCAT62(propertyRecordUsageCache._2_6_,local_34.bits);
  bVar6 = ValueType::IsUninitialized((ValueType *)&propertyRecordUsageCache);
  if ((bVar6) && (local_32 == FldInfo_NoInfo)) {
    pDVar12 = FunctionBody::GetDynamicProfileInfo(functionBody);
    DynamicProfileInfo::RecordElementStoreAsProfiled(pDVar12,functionBody,profileId);
    return;
  }
  if (cacheOwner != (RecyclableObject *)0x0) {
    bVar6 = JavascriptArray::HasNoMissingValues((JavascriptArray *)cacheOwner);
    local_31 = local_31 & 0xfd | ((local_31 & 2) >> 1 & ~bVar6) * '\x02';
  }
  pDVar12 = FunctionBody::GetDynamicProfileInfo(functionBody);
LAB_00af569c:
  DynamicProfileInfo::RecordElementStore
            (pDVar12,functionBody,profileId,(StElemInfo *)&local_34.field_0);
  return;
}

Assistant:

void ProfilingHelpers::ProfiledStElem(
        const Var base,
        const Var varIndex,
        const Var value,
        FunctionBody *const functionBody,
        const ProfileId profileId,
        const PropertyOperationFlags flags,
        bool didArrayAccessHelperCall,
        bool bailedOutOnArraySpecialization)
    {
        JIT_HELPER_REENTRANT_HEADER(ProfiledStElem);
        Assert(base);
        Assert(varIndex);
        Assert(value);
        Assert(functionBody);
        Assert(profileId != Constants::NoProfileId);

        StElemInfo stElemInfo;

        if (bailedOutOnArraySpecialization)
        {
            stElemInfo.disableAggressiveSpecialization = true;
        }

        // Only enable fast path if the javascript array is not cross site
        const bool isJsArray = !TaggedNumber::Is(base) && VirtualTableInfo<JavascriptArray>::HasVirtualTable(base);
        ScriptContext *const scriptContext = functionBody->GetScriptContext();
        const bool fastPath = isJsArray && !JavascriptOperators::SetElementMayHaveImplicitCalls(scriptContext);
        if(fastPath)
        {
            JavascriptArray *const array = UnsafeVarTo<JavascriptArray>(base);
            stElemInfo.arrayType = ValueType::FromArray(ObjectType::Array, array, TypeIds_Array).ToLikely();
            stElemInfo.createdMissingValue = array->HasNoMissingValues();

            ProfiledStElem_FastPath(array, varIndex, value, scriptContext, flags, &stElemInfo);

            stElemInfo.createdMissingValue &= !array->HasNoMissingValues();
            functionBody->GetDynamicProfileInfo()->RecordElementStore(functionBody, profileId, stElemInfo);
            return;
        }

        JavascriptArray *array;
        bool isObjectWithArray;
        TypeId arrayTypeId;
        if(isJsArray)
        {
            array = UnsafeVarTo<JavascriptArray>(base);
            isObjectWithArray = false;
            arrayTypeId = TypeIds_Array;
        }
        else
        {
            array = JavascriptArray::GetArrayForArrayOrObjectWithArray(base, &isObjectWithArray, &arrayTypeId);
        }

#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(base);
#endif

        do // while(false)
        {
            // The fast path is only for JavascriptArray and doesn't cover native arrays, objects with internal arrays, or typed
            // arrays, but we still need to profile the array

            uint32 length;
            uint32 headSegmentLength;
            if(array)
            {
                stElemInfo.arrayType =
                    (
                        isObjectWithArray
                            ? ValueType::FromObjectArray(array)
                            : ValueType::FromArray(ObjectType::Array, array, arrayTypeId)
                    ).ToLikely();
                stElemInfo.createdMissingValue = array->HasNoMissingValues();

                length = array->GetLength();
                SparseArraySegmentBase *const head = array->GetHead();
                Assert(head->left == 0);
                headSegmentLength = head->length;
            }
            else if(TypedArrayBase::TryGetLengthForOptimizedTypedArray(base, &headSegmentLength, &arrayTypeId))
            {
                length = headSegmentLength;
                bool isVirtual = (VirtualTableInfoBase::GetVirtualTable(base) == ValueType::GetVirtualTypedArrayVtable(arrayTypeId));
                stElemInfo.arrayType = ValueType::FromTypeId(arrayTypeId, isVirtual).ToLikely();
                if (!TaggedNumber::Is(value) && !JavascriptNumber::Is_NoTaggedIntCheck(value))
                {
                    // Non-number stored to a typed array. A helper call will be needed to convert the value.
                    stElemInfo.neededHelperCall = true;
                }
            }
            else
            {
                break;
            }

            if (didArrayAccessHelperCall)
            {
                stElemInfo.neededHelperCall = true;
            }

            if(!TaggedInt::Is(varIndex))
            {
                stElemInfo.neededHelperCall = true;
                break;
            }

            const int32 index = TaggedInt::ToInt32(varIndex);
            if(index < 0)
            {
                stElemInfo.neededHelperCall = true;
                break;
            }

            const uint32 offset = index;
            if(offset >= headSegmentLength)
            {
                stElemInfo.storedOutsideHeadSegmentBounds = true;
                if(!isObjectWithArray && offset >= length)
                {
                    stElemInfo.storedOutsideArrayBounds = true;
                }
                break;
            }

            if(array && array->IsMissingHeadSegmentItem(offset))
            {
                stElemInfo.filledMissingValue = true;
            }
        } while(false);

        RecyclableObject* cacheOwner;
        PropertyRecordUsageCache* propertyRecordUsageCache;
        TypeId instanceType = JavascriptOperators::GetTypeId(base);
        bool isTypedArray = (instanceType >= TypeIds_Int8Array && instanceType <= TypeIds_Float64Array);
        if (!isTypedArray && JavascriptOperators::GetPropertyRecordUsageCache(varIndex, scriptContext, &propertyRecordUsageCache, &cacheOwner))
        {
            RecyclableObject* object = nullptr;
            bool result = JavascriptOperators::GetPropertyObjectForSetElementI(base, cacheOwner, scriptContext, &object);
            Assert(result);

            PropertyCacheOperationInfo operationInfo;
            JavascriptOperators::SetElementIWithCache<true /* ReturnOperationInfo */>(base, object, cacheOwner, value, propertyRecordUsageCache, scriptContext, flags, &operationInfo);

            stElemInfo.flags = DynamicProfileInfo::FldInfoFlagsFromCacheType(operationInfo.cacheType);
            stElemInfo.flags = DynamicProfileInfo::MergeFldInfoFlags(stElemInfo.flags, DynamicProfileInfo::FldInfoFlagsFromSlotType(operationInfo.slotType));
        }
        else
        {
            JavascriptOperators::OP_SetElementI(base, varIndex, value, scriptContext, flags);
        }

        if(!stElemInfo.GetArrayType().IsUninitialized() || stElemInfo.flags != Js::FldInfo_NoInfo)
        {
            if(array)
            {
                stElemInfo.createdMissingValue &= !array->HasNoMissingValues();
            }

            functionBody->GetDynamicProfileInfo()->RecordElementStore(functionBody, profileId, stElemInfo);
            return;
        }

        functionBody->GetDynamicProfileInfo()->RecordElementStoreAsProfiled(functionBody, profileId);
        JIT_HELPER_END(ProfiledStElem);
    }